

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomPoint::read(DomPoint *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  long lVar2;
  undefined4 in_register_00000034;
  QString *pQVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QStringView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_78;
  QString local_60;
  QStringView local_48;
  long local_38;
  
  pQVar3 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QXmlStreamReader::error();
  if (iVar1 == 0) {
    do {
      iVar1 = QXmlStreamReader::readNext();
      if (iVar1 == 4) {
        local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_48.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = (QStringView)QXmlStreamReader::name();
        QVar6.m_data = L"x";
        QVar6.m_size = 1;
        iVar1 = QtPrivate::compareStrings(local_48,QVar6,CaseInsensitive);
        if (iVar1 == 0) {
          QXmlStreamReader::readElementText(&local_60,pQVar3,0);
          QVar4.m_data = local_60.d.ptr;
          QVar4.m_size = local_60.d.size;
          lVar2 = QString::toIntegral_helper(QVar4,(bool *)0x0,10);
          iVar1 = (int)lVar2;
          if ((int)lVar2 != lVar2) {
            iVar1 = 0;
          }
          *(byte *)&this->m_children = (byte)this->m_children | 1;
          this->m_x = iVar1;
        }
        else {
          QVar7.m_data = L"y";
          QVar7.m_size = 1;
          iVar1 = QtPrivate::compareStrings(local_48,QVar7,CaseInsensitive);
          if (iVar1 == 0) {
            QXmlStreamReader::readElementText(&local_60,pQVar3,0);
            QVar5.m_data = local_60.d.ptr;
            QVar5.m_size = local_60.d.size;
            lVar2 = QString::toIntegral_helper(QVar5,(bool *)0x0,10);
            iVar1 = (int)lVar2;
            if ((int)lVar2 != lVar2) {
              iVar1 = 0;
            }
            *(byte *)&this->m_children = (byte)this->m_children | 2;
            this->m_y = iVar1;
          }
          else {
            local_78.a.m_size = 0x13;
            local_78.a.m_data = "Unexpected element ";
            local_78.b = &local_48;
            QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                      (&local_60,&local_78);
            QXmlStreamReader::raiseError(pQVar3);
          }
        }
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else if (iVar1 == 5) break;
      iVar1 = QXmlStreamReader::error();
    } while (iVar1 == 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomPoint::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"x"_s, Qt::CaseInsensitive)) {
                setElementX(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"y"_s, Qt::CaseInsensitive)) {
                setElementY(reader.readElementText().toInt());
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}